

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall
spv::Builder::createCompositeConstruct(Builder *this,Id typeId,Vector<Id> *constituents)

{
  uint *puVar1;
  pointer ppIVar2;
  iterator __position;
  Block *pBVar3;
  int iVar4;
  Id IVar5;
  Instruction *instruction;
  pointer puVar6;
  uint *puVar7;
  uint *puVar8;
  uint *puVar9;
  long lVar10;
  ulong uVar11;
  Instruction *raw_instruction;
  uint local_3c;
  _Head_base<0UL,_spv::Instruction_*,_false> local_38;
  
  if ((2 < (this->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start[typeId]->opCode - OpTypeArray) &&
     ((iVar4 = getNumTypeConstituents(this,typeId), iVar4 < 2 ||
      (iVar4 = getNumTypeConstituents(this,typeId),
      iVar4 != (int)((ulong)((long)(constituents->
                                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                   )._M_impl.super__Vector_impl_data._M_finish -
                            (long)(constituents->
                                  super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                  )._M_impl.super__Vector_impl_data._M_start) >> 2))))) {
    __assert_fail("isAggregateType(typeId) || (getNumTypeConstituents(typeId) > 1 && getNumTypeConstituents(typeId) == (int)constituents.size())"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.cpp"
                  ,0x7be,
                  "Id spv::Builder::createCompositeConstruct(Id, const dxil_spv::Vector<Id> &)");
  }
  if (this->generatingOpCodeForSpecConst != true) {
    instruction = (Instruction *)::dxil_spv::allocate_in_thread(0x38);
    IVar5 = this->uniqueId + 1;
    this->uniqueId = IVar5;
    instruction->_vptr_Instruction = (_func_int **)&PTR__Instruction_001f31e0;
    instruction->resultId = IVar5;
    instruction->typeId = typeId;
    instruction->opCode = OpCompositeConstruct;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    (instruction->operands).
    super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    instruction->block = (Block *)0x0;
    puVar6 = (constituents->
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
             _M_impl.super__Vector_impl_data._M_start;
    if (0 < (int)((ulong)((long)(constituents->
                                super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                )._M_impl.super__Vector_impl_data._M_finish - (long)puVar6) >> 2)) {
      lVar10 = 0;
      do {
        local_3c = puVar6[lVar10];
        __position._M_current =
             (instruction->operands).
             super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (instruction->operands).
            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>>::
          _M_realloc_insert<unsigned_int_const&>
                    ((vector<unsigned_int,dxil_spv::ThreadLocalAllocator<unsigned_int>> *)
                     &instruction->operands,__position,&local_3c);
          puVar6 = (constituents->
                   super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>).
                   _M_impl.super__Vector_impl_data._M_start;
        }
        else {
          *__position._M_current = local_3c;
          (instruction->operands).
          super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_finish = __position._M_current + 1;
        }
        lVar10 = lVar10 + 1;
      } while (lVar10 < (int)((ulong)((long)(constituents->
                                            super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                     (long)puVar6) >> 2));
    }
    pBVar3 = this->buildPoint;
    local_38._M_head_impl = instruction;
    std::
    vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
    ::emplace_back<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>
              ((vector<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>,dxil_spv::ThreadLocalAllocator<std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>>>
                *)&pBVar3->instructions,
               (unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> *)&local_38);
    instruction->block = pBVar3;
    if (instruction->resultId != 0) {
      Module::mapInstruction(pBVar3->parent->parent,instruction);
    }
    if (local_38._M_head_impl != (Instruction *)0x0) {
      (*(local_38._M_head_impl)->_vptr_Instruction[1])();
    }
    return instruction->resultId;
  }
  puVar8 = (constituents->
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (constituents->
           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  ppIVar2 = (this->module).idToInstruction.
            super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  uVar11 = (long)puVar1 - (long)puVar8;
  if (0 < (long)uVar11 >> 4) {
    puVar7 = (uint *)((uVar11 & 0xfffffffffffffff0) + (long)puVar8);
    lVar10 = ((long)uVar11 >> 4) + 1;
    puVar9 = puVar8 + 2;
    do {
      if (ppIVar2[puVar9[-2]]->opCode - OpSpecConstantTrue < 5) {
        puVar9 = puVar9 + -2;
        goto LAB_001b7aa7;
      }
      if (ppIVar2[puVar9[-1]]->opCode - OpSpecConstantTrue < 5) {
        puVar9 = puVar9 + -1;
        goto LAB_001b7aa7;
      }
      if (ppIVar2[*puVar9]->opCode - OpSpecConstantTrue < 5) goto LAB_001b7aa7;
      if (ppIVar2[puVar9[1]]->opCode - OpSpecConstantTrue < 5) {
        puVar9 = puVar9 + 1;
        goto LAB_001b7aa7;
      }
      lVar10 = lVar10 + -1;
      puVar9 = puVar9 + 4;
    } while (1 < lVar10);
    uVar11 = (long)puVar1 - (long)puVar7;
    puVar8 = puVar7;
  }
  lVar10 = (long)uVar11 >> 2;
  if (lVar10 != 1) {
    if (lVar10 != 2) {
      puVar9 = puVar1;
      if ((lVar10 != 3) || (puVar9 = puVar8, ppIVar2[*puVar8]->opCode - OpSpecConstantTrue < 5))
      goto LAB_001b7aa7;
      puVar8 = puVar8 + 1;
    }
    puVar9 = puVar8;
    if (ppIVar2[*puVar8]->opCode - OpSpecConstantTrue < 5) goto LAB_001b7aa7;
    puVar8 = puVar8 + 1;
  }
  puVar9 = puVar8;
  if (4 < ppIVar2[*puVar8]->opCode - OpSpecConstantTrue) {
    puVar9 = puVar1;
  }
LAB_001b7aa7:
  IVar5 = makeCompositeConstant(this,typeId,constituents,puVar9 != puVar1);
  return IVar5;
}

Assistant:

Id Builder::createCompositeConstruct(Id typeId, const dxil_spv::Vector<Id>& constituents)
{
    assert(isAggregateType(typeId) || (getNumTypeConstituents(typeId) > 1 && getNumTypeConstituents(typeId) == (int)constituents.size()));

    if (generatingOpCodeForSpecConst) {
        // Sometime, even in spec-constant-op mode, the constant composite to be
        // constructed may not be a specialization constant.
        // e.g.:
        //  const mat2 m2 = mat2(a_spec_const, a_front_end_const, another_front_end_const, third_front_end_const);
        // The first column vector should be a spec constant one, as a_spec_const is a spec constant.
        // The second column vector should NOT be spec constant, as it does not contain any spec constants.
        // To handle such cases, we check the constituents of the constant vector to determine whether this
        // vector should be created as a spec constant.
        return makeCompositeConstant(typeId, constituents,
                                     std::any_of(constituents.begin(), constituents.end(),
                                                 [&](spv::Id id) { return isSpecConstant(id); }));
    }

    Instruction* op = new Instruction(getUniqueId(), typeId, OpCompositeConstruct);
    for (int c = 0; c < (int)constituents.size(); ++c)
        op->addIdOperand(constituents[c]);
    buildPoint->addInstruction(std::unique_ptr<Instruction>(op));

    return op->getResultId();
}